

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

bool __thiscall OpenMD::SelectionCompiler::clauseAlphaHull(SelectionCompiler *this)

{
  any *paVar1;
  int iVar2;
  bool bVar3;
  any alpha;
  Token tokenAlpha;
  _Arg __arg;
  any local_78;
  Token local_68;
  Token local_50;
  Token local_38;
  _Arg local_20;
  
  tokenNext(&local_38,this);
  if (local_38.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_38.value._M_manager)(_Op_destroy,&local_38.value,(_Arg *)0x0);
    local_38.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  tokenNext(&local_50,this);
  iVar2 = local_50.tok;
  if (local_50.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_50.value._M_manager)(_Op_destroy,&local_50.value,(_Arg *)0x0);
    local_50.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (iVar2 == 0x400) {
    local_78._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    local_78._M_storage._M_ptr = (void *)0x0;
    tokenNext(&local_50,this);
    if ((local_50.tok & 0xfffffffeU) == 2) {
      std::any::operator=(&local_78,&local_50.value);
      tokenNext(&local_68,this);
      paVar1 = &local_68.value;
      iVar2 = local_68.tok;
      if (local_68.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_68.value._M_manager)(_Op_destroy,paVar1,(_Arg *)0x0);
        local_68.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      }
      if (iVar2 == 0x401) {
        local_68.tok = 0x140d;
        local_68.intValue = 0;
        local_68.value._M_storage._M_ptr = (void *)0x0;
        if (local_78._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          local_68.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        else {
          local_20._M_any = paVar1;
          (*local_78._M_manager)(_Op_clone,&local_78,&local_20);
        }
        std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                  (&this->ltokenPostfix,&local_68);
        if (local_68.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*local_68.value._M_manager)(_Op_destroy,paVar1,(_Arg *)0x0);
          local_68.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        bVar3 = true;
      }
      else {
        bVar3 = rightParenthesisExpected(this);
      }
    }
    else {
      bVar3 = numberOrKeywordExpected(this);
    }
    if (local_50.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_50.value._M_manager)(_Op_destroy,&local_50.value,(_Arg *)0x0);
      local_50.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    if (local_78._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_78._M_manager)(_Op_destroy,&local_78,(_Arg *)0x0);
    }
  }
  else {
    bVar3 = leftParenthesisExpected(this);
  }
  return bVar3;
}

Assistant:

bool SelectionCompiler::clauseAlphaHull() {
    tokenNext();                                // alphaHull
    if (tokenNext().tok != Token::leftparen) {  // (
      return leftParenthesisExpected();
    }

    std::any alpha;
    Token tokenAlpha = tokenNext();  // alpha
    switch (tokenAlpha.tok) {
    case Token::integer:
    case Token::decimal:
      alpha = tokenAlpha.value;
      break;
    default:
      return numberOrKeywordExpected();
    }

    if (tokenNext().tok != Token::rightparen) {  // )T
      return rightParenthesisExpected();
    }

    return addTokenToPostfix(Token(Token::alphahull, alpha));
  }